

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall qclab::qgates::Hadamard<double>::Hadamard(Hadamard<double> *this,int qubit)

{
  int qubit_local;
  Hadamard<double> *this_local;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,qubit);
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0014dfb8;
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }